

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.capnp.h
# Opt level: O2

Builder * __thiscall
capnp::compiler::Token::Builder::initBracketedList
          (Builder *__return_storage_ptr__,Builder *this,uint size)

{
  PointerBuilder local_28;
  
  *(undefined2 *)(this->_builder).data = 6;
  local_28.pointer = (this->_builder).pointers;
  local_28.segment = (this->_builder).segment;
  local_28.capTable = (this->_builder).capTable;
  capnp::_::PointerBuilder::initList(&__return_storage_ptr__->builder,&local_28,POINTER,size);
  return __return_storage_ptr__;
}

Assistant:

inline  ::capnp::List< ::capnp::List< ::capnp::compiler::Token,  ::capnp::Kind::STRUCT>,  ::capnp::Kind::LIST>::Builder Token::Builder::initBracketedList(unsigned int size) {
  _builder.setDataField<Token::Which>(
      ::capnp::bounded<0>() * ::capnp::ELEMENTS, Token::BRACKETED_LIST);
  return ::capnp::_::PointerHelpers< ::capnp::List< ::capnp::List< ::capnp::compiler::Token,  ::capnp::Kind::STRUCT>,  ::capnp::Kind::LIST>>::init(_builder.getPointerField(
      ::capnp::bounded<0>() * ::capnp::POINTERS), size);
}